

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O0

void __thiscall StunMsgCxx_ErrorResponse_Test::TestBody(StunMsgCxx_ErrorResponse_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  base_message<std::allocator<unsigned_char>_> *msg;
  char *pcVar3;
  uint8_t *vec_b;
  pointer pdVar4;
  char *in_R9;
  iterator iVar5;
  decoding_type dVar6;
  decoding_type dVar7;
  string local_3d0;
  AssertHelper local_3b0;
  Message local_3a8;
  decoded local_3a0;
  decoded local_390;
  undefined1 local_380 [8];
  AssertionResult gtest_ar__3;
  Message local_368;
  uint16_t local_35a;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_7;
  size_t i_1;
  Message local_338;
  size_t local_330;
  unsigned_long local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_6;
  unknown_attributes unk;
  Message local_2f8;
  uint16_t local_2ee;
  attribute_type local_2ec;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_2b8;
  Message local_2b0;
  decoded local_2a8;
  decoded local_298;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__2;
  Message local_270;
  string local_268;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_4;
  Message local_230;
  int local_228 [2];
  undefined1 local_220 [8];
  AssertionResult gtest_ar_3;
  error_code errcode;
  Message local_1f8;
  uint16_t local_1ee;
  attribute_type local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1b8;
  Message local_1b0;
  decoded local_1a8;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__1;
  iterator i;
  Message local_170;
  uint16_t local_166;
  type local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_130;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_108;
  Message local_100;
  size_t local_f8;
  unsigned_long local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  errcode local_b0;
  undefined1 local_98 [8];
  message message;
  uint16_t unknown [3];
  uint8_t tsx_id [12];
  uint8_t expected_result [60];
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char reason_phrase [18];
  StunMsgCxx_ErrorResponse_Test *this_local;
  
  builtin_memcpy(expected_result + 0x38,"Unkn",4);
  cStack_24 = 'o';
  cStack_23 = 'w';
  cStack_22 = 'n';
  cStack_21 = ' ';
  expected_result[0x28] = '\0';
  expected_result[0x29] = '\n';
  expected_result[0x2a] = '\0';
  expected_result[0x2b] = '\x06';
  expected_result[0x2c] = '\0';
  expected_result[0x2d] = '\x1a';
  expected_result[0x2e] = '\0';
  expected_result[0x2f] = '\x1b';
  expected_result[0x30] = 0x80;
  expected_result[0x31] = ',';
  expected_result[0x32] = '\0';
  expected_result[0x33] = '\0';
  builtin_memcpy(expected_result + 0x18,"own Attribute",0xe);
  expected_result[0x26] = '\0';
  expected_result[0x27] = '\0';
  expected_result[8] = ')';
  expected_result[9] = 0xda;
  expected_result[10] = 'A';
  expected_result[0xb] = '.';
  expected_result[0xc] = '\0';
  expected_result[0xd] = '\t';
  expected_result[0xe] = '\0';
  expected_result[0xf] = '\x15';
  expected_result[0x10] = '\0';
  expected_result[0x11] = '\0';
  expected_result[0x12] = '\x04';
  expected_result[0x13] = '\x14';
  expected_result[0x14] = 'U';
  expected_result[0x15] = 'n';
  expected_result[0x16] = 'k';
  expected_result[0x17] = 'n';
  stack0xffffffffffffff98 = 0x42a4122128001101;
  expected_result[0] = 'x';
  expected_result[1] = 0xad;
  expected_result[2] = '4';
  expected_result[3] = '3';
  expected_result[4] = 0xc6;
  expected_result[5] = 0xad;
  expected_result[6] = 'r';
  expected_result[7] = 0xc0;
  _unknown = 0xc072adc63334ad78;
  tsx_id[0] = ')';
  tsx_id[1] = 0xda;
  tsx_id[2] = 'A';
  tsx_id[3] = '.';
  message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_2_ = 0x802c;
  message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x1b001a;
  stun::base_message<std::allocator<unsigned_char>_>::base_message
            ((base_message<std::allocator<unsigned_char>_> *)local_98,0x111,(uint8_t *)unknown);
  stun::attribute::error_code(&local_b0,0x1a4,(char *)(expected_result + 0x38),'\0');
  msg = stun::operator<<((base_message<std::allocator<unsigned_char>_> *)local_98,&local_b0);
  stun::attribute::unknown_attributes
            ((unknown *)&gtest_ar.message_,
             (uint16_t *)
             &message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,3,'\0');
  stun::operator<<(msg,(unknown *)&gtest_ar.message_);
  local_f0 = 0x3c;
  local_f8 = stun::base_message<std::allocator<unsigned_char>_>::size
                       ((base_message<std::allocator<unsigned_char>_> *)local_98);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_e8,"sizeof(expected_result)","message.size()",&local_f0,
             &local_f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar2) {
    testing::Message::Message(&local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1dd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  gtest_ar_.message_.ptr_._5_3_ = 0;
  gtest_ar_.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  if (gtest_ar_.message_.ptr_._4_4_ == 0) {
    vec_b = stun::base_message<std::allocator<unsigned_char>_>::data
                      ((base_message<std::allocator<unsigned_char>_> *)local_98);
    anon_unknown.dwarf_f3ff::IsEqual((anon_unknown_dwarf_f3ff *)local_120,tsx_id + 8,vec_b,0x3c);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
    if (!bVar2) {
      testing::Message::Message(&local_128);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_120,
                 (AssertionResult *)
                 "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1df,pcVar3);
      testing::internal::AssertHelper::operator=(&local_130,&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_128);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
    local_164 = binding_error_response;
    local_166 = stun::base_message<std::allocator<unsigned_char>_>::type
                          ((base_message<std::allocator<unsigned_char>_> *)local_98);
    testing::internal::EqHelper<false>::
    Compare<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
              ((EqHelper<false> *)local_160,"stun::message::binding_error_response","message.type()"
               ,&local_164,&local_166);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
    if (!bVar2) {
      testing::Message::Message(&local_170);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i.attr_.attr_hdr_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1e3,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i.attr_.attr_hdr_,&local_170);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i.attr_.attr_hdr_);
      testing::Message::~Message(&local_170);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
    iVar5 = stun::base_message<std::allocator<unsigned_char>_>::begin
                      ((base_message<std::allocator<unsigned_char>_> *)local_98);
    i.attr_.msg_hdr_ = (stun_msg_hdr *)iVar5.attr_.attr_hdr_;
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar5.attr_.msg_hdr_;
    local_1a8 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                   ((base_message<std::allocator<unsigned_char>_> *)local_98);
    bVar2 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                      ((iterator *)&local_1a8,(self_type *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult((AssertionResult *)local_198,bVar2);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
    if (!bVar2) {
      testing::Message::Message(&local_1b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_2.message_,(internal *)local_198,
                 (AssertionResult *)"message.end() != i","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1e6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_1b0);
    }
    gtest_ar_.message_.ptr_._5_3_ = 0;
    gtest_ar_.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
    if (gtest_ar_.message_.ptr_._4_4_ == 0) {
      local_1ec = error_code;
      pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                         ((iterator *)&gtest_ar__1.message_);
      local_1ee = stun::attribute::decoded::type(pdVar4);
      testing::internal::EqHelper<false>::
      Compare<stun::attribute::type::attribute_type,unsigned_short>
                ((EqHelper<false> *)local_1e8,"type::error_code","i->type()",&local_1ec,&local_1ee);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
      if (!bVar2) {
        testing::Message::Message(&local_1f8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&errcode.super_attribute_base<_stun_attr_errcode>.attr_,
                   kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1e7,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&errcode.super_attribute_base<_stun_attr_errcode>.attr_,
                   &local_1f8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)&errcode.super_attribute_base<_stun_attr_errcode>.attr_);
        testing::Message::~Message(&local_1f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
      pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                         ((iterator *)&gtest_ar__1.message_);
      dVar6 = stun::attribute::decoded::to<(stun::attribute::type::attribute_type)9>(pdVar4);
      errcode.super_attribute_base<_stun_attr_errcode>.msg_hdr_ =
           (stun_msg_hdr *)dVar6.super_attribute_base<_stun_attr_errcode>.attr_;
      gtest_ar_3.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           dVar6.super_attribute_base<_stun_attr_errcode>.msg_hdr_;
      local_228[1] = 0x1a4;
      local_228[0] = stun::attribute::decoding_bits::errcode::status_code
                               ((errcode *)&gtest_ar_3.message_);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_220,"420","errcode.status_code()",local_228 + 1,local_228)
      ;
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
      if (!bVar2) {
        testing::Message::Message(&local_230);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1ea,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_230);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_230);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
      stun::attribute::decoding_bits::errcode::reason_phrase_abi_cxx11_
                (&local_268,(errcode *)&gtest_ar_3.message_);
      testing::internal::EqHelper<false>::Compare<char[18],std::__cxx11::string>
                ((EqHelper<false> *)local_248,"reason_phrase","errcode.reason_phrase()",
                 (char (*) [18])(expected_result + 0x38),&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
      if (!bVar2) {
        testing::Message::Message(&local_270);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1eb,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_270)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_270);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
      local_298 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                     ((base_message<std::allocator<unsigned_char>_> *)local_98);
      local_2a8 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++
                                     ((iterator *)&gtest_ar__1.message_);
      bVar2 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                        ((iterator *)&local_298,(self_type *)&local_2a8);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_288,bVar2);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
      if (!bVar2) {
        testing::Message::Message(&local_2b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_5.message_,(internal *)local_288,
                   (AssertionResult *)"message.end() != ++i","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_2b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1ed,pcVar3);
        testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_2b8);
        std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_2b0);
      }
      gtest_ar_.message_.ptr_._5_3_ = 0;
      gtest_ar_.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
      if (gtest_ar_.message_.ptr_._4_4_ == 0) {
        local_2ec = unknown_attributes;
        pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                           ((iterator *)&gtest_ar__1.message_);
        local_2ee = stun::attribute::decoded::type(pdVar4);
        testing::internal::EqHelper<false>::
        Compare<stun::attribute::type::attribute_type,unsigned_short>
                  ((EqHelper<false> *)local_2e8,"type::unknown_attributes","i->type()",&local_2ec,
                   &local_2ee);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
        if (!bVar2) {
          testing::Message::Message(&local_2f8);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&unk.super_attribute_base<_stun_attr_unknown>.attr_,
                     kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0x1ee,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&unk.super_attribute_base<_stun_attr_unknown>.attr_,&local_2f8)
          ;
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)&unk.super_attribute_base<_stun_attr_unknown>.attr_);
          testing::Message::~Message(&local_2f8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
        pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                           ((iterator *)&gtest_ar__1.message_);
        dVar7 = stun::attribute::decoded::to<(stun::attribute::type::attribute_type)10>(pdVar4);
        unk.super_attribute_base<_stun_attr_unknown>.msg_hdr_ =
             (stun_msg_hdr *)dVar7.super_attribute_base<_stun_attr_unknown>.attr_;
        gtest_ar_6.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             dVar7.super_attribute_base<_stun_attr_unknown>.msg_hdr_;
        local_328 = 3;
        local_330 = stun::attribute::decoding_bits::unknown::size((unknown *)&gtest_ar_6.message_);
        testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                  ((EqHelper<false> *)local_320,"(sizeof(unknown)/sizeof(unknown[0]))","unk.size()",
                   &local_328,&local_330);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
        if (!bVar2) {
          testing::Message::Message(&local_338);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&i_1,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0x1f1,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,&local_338);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
          testing::Message::~Message(&local_338);
        }
        gtest_ar_.message_.ptr_._5_3_ = 0;
        gtest_ar_.message_.ptr_._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
        if (gtest_ar_.message_.ptr_._4_4_ == 0) {
          for (gtest_ar_7.message_.ptr_ =
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              gtest_ar_7.message_.ptr_ <
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
              gtest_ar_7.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(gtest_ar_7.message_.ptr_)->field_0x1) {
            pbVar1 = gtest_ar_7.message_.ptr_ + -1;
            local_35a = stun::attribute::decoding_bits::unknown::operator[]
                                  ((unknown *)&gtest_ar_6.message_,(size_t)gtest_ar_7.message_.ptr_)
            ;
            testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
                      ((EqHelper<false> *)local_358,"unknown[i]","unk[i]",
                       unknown + (long)&(pbVar1->field_2)._M_allocated_capacity + 0xc,&local_35a);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
            if (!bVar2) {
              testing::Message::Message(&local_368);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                         ,499,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__3.message_,&local_368);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
              testing::Message::~Message(&local_368);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
          }
          local_390 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                         ((base_message<std::allocator<unsigned_char>_> *)local_98);
          local_3a0 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                               operator++((iterator *)&gtest_ar__1.message_);
          bVar2 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator==
                            ((iterator *)&local_390,(self_type *)&local_3a0);
          testing::AssertionResult::AssertionResult((AssertionResult *)local_380,bVar2);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
          if (!bVar2) {
            testing::Message::Message(&local_3a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_3d0,(internal *)local_380,(AssertionResult *)"message.end() == ++i",
                       "false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_3b0,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x1f6,pcVar3);
            testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
            testing::internal::AssertHelper::~AssertHelper(&local_3b0);
            std::__cxx11::string::~string((string *)&local_3d0);
            testing::Message::~Message(&local_3a8);
          }
          gtest_ar_.message_.ptr_._5_3_ = 0;
          gtest_ar_.message_.ptr_._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
          if (gtest_ar_.message_.ptr_._4_4_ == 0) {
            gtest_ar_.message_.ptr_._4_4_ = 0;
          }
        }
      }
    }
  }
  stun::base_message<std::allocator<unsigned_char>_>::~base_message
            ((base_message<std::allocator<unsigned_char>_> *)local_98);
  return;
}

Assistant:

TEST(StunMsgCxx, ErrorResponse) {
  const char reason_phrase[] = "Unknown Attribute";
  const uint8_t expected_result[] = {
    0x01,0x11,0x00,0x28, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0x78,0xad,0x34,0x33, // }
    0xc6,0xad,0x72,0xc0, // }  Transaction ID
    0x29,0xda,0x41,0x2e, // }
    0x00,0x09,0x00,0x15, //    ERROR-CODE attribute header
    0x00,0x00,0x04,0x14, //    class = 4, code = 20 (420)
    0x55,0x6e,0x6b,0x6e, // }
    0x6f,0x77,0x6e,0x20, // }
    0x41,0x74,0x74,0x72, // }  Reason: Unknown Attribute
    0x69,0x62,0x75,0x74, // }
    0x65,0x00,0x00,0x00, // }
    0x00,0x0A,0x00,0x06, //    UNKNOWN-ATTRIBUTES attribute header
    0x00,0x1A,0x00,0x1B, //    0x001A, 0x001B
    0x80,0x2C,0x00,0x00, //    0x802C
  };

  uint8_t tsx_id[12] = {
    0x78,0xad,0x34,0x33,
    0xc6,0xad,0x72,0xc0,
    0x29,0xda,0x41,0x2e,
  };
  uint16_t unknown[] = { 0x001a, 0x001b, 0x802c };

  stun::message message(stun::message::binding_error_response, tsx_id);
  message << stun::attribute::error_code(420, reason_phrase)
          << stun::attribute::unknown_attributes(unknown, ARRAY_SIZE(unknown));
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_error_response, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::error_code, i->type());
  stun::attribute::decoding::error_code errcode =
    i->to<type::error_code>();
  EXPECT_EQ(420, errcode.status_code());
  EXPECT_EQ(reason_phrase, errcode.reason_phrase());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::unknown_attributes, i->type());
  stun::attribute::decoding::unknown_attributes unk =
    i->to<type::unknown_attributes>();
  ASSERT_EQ(ARRAY_SIZE(unknown), unk.size());
  for (size_t i = 0; i < ARRAY_SIZE(unknown); i++) {
    EXPECT_EQ(unknown[i], unk[i]);
  }

  ASSERT_TRUE(message.end() == ++i);
}